

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::updateScrollbars(QColumnViewPrivate *this)

{
  QScrollBar *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QColumnView *pQVar5;
  int *piVar6;
  uint uVar7;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool visible;
  int pageStepSize;
  int hiddenLength;
  int visibleLength;
  int horizontalLength;
  QColumnView *q;
  QSize viewportSize;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_2c;
  int local_18;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  iVar3 = QAbstractAnimation::state();
  if (iVar3 != 2) {
    local_2c = 0;
    bVar2 = QList<QAbstractItemView_*>::isEmpty((QList<QAbstractItemView_*> *)0x863133);
    if (!bVar2) {
      QList<QAbstractItemView_*>::constLast
                ((QList<QAbstractItemView_*> *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      iVar3 = QWidget::x((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      QList<QAbstractItemView_*>::constLast
                ((QList<QAbstractItemView_*> *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      iVar4 = QWidget::width((QWidget *)0x863171);
      QList<QAbstractItemView_*>::constFirst
                ((QList<QAbstractItemView_*> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_2c = QWidget::x((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                           );
      local_2c = (iVar3 + iVar4) - local_2c;
      if (local_2c < 1) {
        QList<QAbstractItemView_*>::constFirst
                  ((QList<QAbstractItemView_*> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        in_stack_ffffffffffffffa8 =
             QWidget::x((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        QList<QAbstractItemView_*>::constFirst
                  ((QList<QAbstractItemView_*> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        in_stack_ffffffffffffffac = QWidget::width((QWidget *)0x8631df);
        in_stack_ffffffffffffffac = in_stack_ffffffffffffffa8 + in_stack_ffffffffffffffac;
        QList<QAbstractItemView_*>::constLast
                  ((QList<QAbstractItemView_*> *)
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        local_2c = QWidget::x((QWidget *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        local_2c = in_stack_ffffffffffffffac - local_2c;
      }
    }
    local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QWidget::size((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    iVar3 = local_2c;
    iVar4 = QSize::width((QSize *)0x863246);
    if ((iVar3 < iVar4) &&
       (iVar4 = QAbstractSlider::value
                          ((QAbstractSlider *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
       iVar4 == 0)) {
      QAbstractSlider::setRange
                ((QAbstractSlider *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    else {
      local_14 = (**(code **)(*(long *)&(pQVar5->super_QAbstractItemView).super_QAbstractScrollArea.
                                        super_QFrame.super_QWidget + 0x2b0))();
      local_14 = local_2c + local_14;
      local_18 = QSize::width((QSize *)0x8632ac);
      piVar6 = qMin<int>(&local_14,&local_18);
      local_2c = local_2c - *piVar6;
      iVar4 = QAbstractSlider::maximum
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (local_2c != iVar4) {
        QAbstractSlider::setRange
                  ((QAbstractSlider *)CONCAT44(iVar3,local_2c),in_stack_ffffffffffffffac,
                   in_stack_ffffffffffffffa8);
      }
    }
    bVar2 = QList<QAbstractItemView_*>::isEmpty((QList<QAbstractItemView_*> *)0x863321);
    if (!bVar2) {
      QList<QAbstractItemView_*>::at
                ((QList<QAbstractItemView_*> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      iVar3 = QWidget::width((QWidget *)0x863342);
      iVar4 = QAbstractSlider::pageStep
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (iVar3 != iVar4) {
        QAbstractSlider::setPageStep
                  ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
      }
    }
    iVar3 = QAbstractSlider::maximum
                      ((QAbstractSlider *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    uVar7 = (uint)(0 < iVar3);
    bVar2 = QWidget::isVisible((QWidget *)0x8633c1);
    if (uVar7 != bVar2) {
      pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar;
      (**(code **)(*(long *)&(pQVar1->super_QAbstractSlider).super_QWidget + 0x68))
                (pQVar1,0 < iVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::updateScrollbars()
{
    Q_Q(QColumnView);
#if QT_CONFIG(animation)
    if (currentAnimation.state() == QPropertyAnimation::Running)
        return;
#endif // animation

    // find the total horizontal length of the laid out columns
    int horizontalLength = 0;
    if (!columns.isEmpty()) {
        horizontalLength = (columns.constLast()->x() + columns.constLast()->width()) - columns.constFirst()->x();
        if (horizontalLength <= 0) // reverse mode
            horizontalLength = (columns.constFirst()->x() + columns.constFirst()->width()) - columns.constLast()->x();
    }

    QSize viewportSize = viewport->size();
    if (horizontalLength < viewportSize.width() && hbar->value() == 0) {
        hbar->setRange(0, 0);
    } else {
        int visibleLength = qMin(horizontalLength + q->horizontalOffset(), viewportSize.width());
        int hiddenLength = horizontalLength - visibleLength;
        if (hiddenLength != hbar->maximum())
            hbar->setRange(0, hiddenLength);
    }
    if (!columns.isEmpty()) {
        int pageStepSize = columns.at(0)->width();
        if (pageStepSize != hbar->pageStep())
            hbar->setPageStep(pageStepSize);
    }
    bool visible = (hbar->maximum() > 0);
    if (visible != hbar->isVisible())
        hbar->setVisible(visible);
}